

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhighdpiscaling.cpp
# Opt level: O3

ScaleAndOrigin QHighDpiScaling::scaleAndOrigin(QScreen *screen,Point position)

{
  QPlatformScreen *platformScreen;
  ulong uVar1;
  ulong uVar2;
  Representation extraout_EDX;
  undefined8 uVar3;
  Point position_00;
  ScaleAndOrigin SVar5;
  qreal qVar4;
  
  uVar3 = position._0_8_;
  if (m_active) {
    qVar4 = m_factor;
    if (screen != (QScreen *)0x0) {
      platformScreen = QScreen::handle(screen);
      position_00.point.yp.m_i = extraout_EDX.m_i;
      position_00.kind = (int)uVar3;
      position_00.point.xp.m_i = (int)((ulong)uVar3 >> 0x20);
      SVar5 = scaleAndOrigin(platformScreen,position_00);
      qVar4 = SVar5.factor;
      uVar1 = (ulong)SVar5.origin & 0xffffffff00000000;
      uVar2 = (ulong)SVar5.origin & 0xffffffff;
      goto LAB_002e3bf2;
    }
  }
  else {
    qVar4 = 1.0;
  }
  uVar1 = 0;
  uVar2 = 0;
LAB_002e3bf2:
  SVar5.origin = (QPoint)(uVar1 | uVar2);
  SVar5.factor = qVar4;
  return SVar5;
}

Assistant:

QHighDpiScaling::ScaleAndOrigin QHighDpiScaling::scaleAndOrigin(const QScreen *screen, QHighDpiScaling::Point position)
{
    Q_UNUSED(position)
    if (!m_active)
        return { qreal(1), QPoint() };
    if (!screen)
        return { m_factor, QPoint() }; // the global factor
    return scaleAndOrigin(screen->handle(), position);
}